

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::Session::~Session(Session *this)

{
  ~Session(this);
  operator_delete(this,400);
  return;
}

Assistant:

Session::~Session() {
        Catch::cleanUp();
    }